

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

int32 feat_s2mfc2feat_live
                (feat_t *fcb,mfcc_t **uttcep,int32 *inout_ncep,int32 beginutt,int32 endutt,
                mfcc_t ***ofeat)

{
  uint win;
  mfcc_t *pmVar1;
  int iVar2;
  int iVar3;
  uint32 nfr;
  mfcc_t **mfc;
  int iVar4;
  ulong uVar5;
  int32 nfr_00;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  long lVar10;
  mfcc_t **ppmVar11;
  int32 iVar12;
  long lVar13;
  int32 iVar14;
  bool bVar15;
  
  if (endutt == 0 || beginutt == 0) {
    iVar12 = fcb->cepsize;
    iVar14 = fcb->window_size;
    if (beginutt != 0) goto LAB_001158e7;
    iVar3 = fcb->bufpos;
    iVar9 = fcb->curpos;
  }
  else {
    if (inout_ncep != (int32 *)0x0) {
      iVar9 = *inout_ncep;
      lVar13 = (long)iVar9;
      if (0 < lVar13) {
        win = fcb->window_size;
        iVar3 = fcb->cepsize;
        iVar2 = iVar9 + win * 2;
        mfc = (mfcc_t **)
              __ckd_calloc__((long)iVar2,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                             ,0x507);
        ppmVar11 = mfc + (int)win;
        memcpy(ppmVar11,uttcep,lVar13 * 8);
        feat_cmn(fcb,ppmVar11,iVar9,1,1);
        feat_agc(fcb,ppmVar11,iVar9,1,1);
        sVar8 = (long)iVar3 << 2;
        uVar6 = 0;
        uVar5 = 0;
        if (0 < (int)win) {
          uVar5 = (ulong)win;
        }
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          pmVar1 = fcb->cepbuf[uVar6];
          mfc[uVar6] = pmVar1;
          memcpy(pmVar1,*uttcep,sVar8);
          pmVar1 = fcb->cepbuf[(long)(int)win + uVar6];
          mfc[(long)(int)(win + iVar9) + uVar6] = pmVar1;
          memcpy(pmVar1,uttcep[lVar13 + -1],sVar8);
        }
        feat_compute_utt(fcb,mfc,iVar2,win,ofeat);
        ckd_free(mfc);
        return iVar9;
      }
    }
    iVar12 = fcb->cepsize;
    iVar14 = fcb->window_size;
LAB_001158e7:
    iVar3 = fcb->curpos;
    fcb->bufpos = iVar3;
    iVar9 = iVar3;
  }
  iVar3 = iVar3 - iVar9;
  iVar9 = iVar3 + 0x100;
  if (-1 < iVar3) {
    iVar9 = iVar3;
  }
  if (beginutt == 0) {
    iVar3 = iVar14;
    if (endutt == 0) {
      iVar3 = 0;
    }
    iVar9 = iVar9 + iVar3;
    if (inout_ncep == (int32 *)0x0) goto LAB_00115992;
    iVar3 = *inout_ncep;
  }
  else {
    if (inout_ncep == (int32 *)0x0) {
      iVar3 = iVar14;
      if (endutt == 0) {
        iVar3 = 0;
      }
      iVar9 = iVar9 + iVar3;
LAB_00115992:
      if (iVar9 < 0x101) {
        iVar2 = 0;
        iVar3 = 0;
      }
      else {
        iVar3 = (0x100 - iVar14) - iVar9;
        endutt = 0;
        iVar2 = iVar3;
      }
      goto LAB_001159b3;
    }
    iVar3 = *inout_ncep;
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar14;
    }
    iVar4 = iVar14;
    if (endutt == 0) {
      iVar4 = 0;
    }
    iVar9 = iVar9 + iVar4 + iVar2;
  }
  if (0x100 < iVar3 + iVar9) {
    iVar3 = (0x100 - iVar14) - iVar9;
    *inout_ncep = iVar3;
    endutt = 0;
  }
  iVar2 = 0;
LAB_001159b3:
  feat_cmn(fcb,uttcep,iVar3,beginutt,endutt);
  nfr_00 = iVar2;
  if (inout_ncep != (int32 *)0x0) {
    nfr_00 = *inout_ncep;
  }
  feat_agc(fcb,uttcep,nfr_00,beginutt,endutt);
  if (beginutt != 0) {
    iVar3 = iVar2;
    if (inout_ncep != (int32 *)0x0) {
      iVar3 = *inout_ncep;
    }
    if (0 < iVar3) {
      iVar3 = 0;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
        iVar4 = fcb->bufpos;
        fcb->bufpos = iVar4 + 1;
        memcpy(fcb->cepbuf[iVar4],*uttcep,(long)iVar12 * 4);
        fcb->bufpos = fcb->bufpos % 0x100;
      }
      fcb->curpos = fcb->bufpos;
      iVar9 = iVar9 - iVar14;
    }
  }
  sVar8 = (long)iVar12 << 2;
  lVar13 = 0;
  while( true ) {
    iVar3 = iVar2;
    if (inout_ncep != (int32 *)0x0) {
      iVar3 = *inout_ncep;
    }
    if (iVar3 <= lVar13) break;
    iVar3 = fcb->bufpos;
    fcb->bufpos = iVar3 + 1;
    memcpy(fcb->cepbuf[iVar3],uttcep[lVar13],sVar8);
    fcb->bufpos = fcb->bufpos % 0x100;
    lVar13 = lVar13 + 1;
  }
  if (endutt != 0) {
    iVar3 = fcb->bufpos;
    iVar2 = 0xff;
    if (iVar3 != 0) {
      iVar2 = iVar3 + -1;
    }
    iVar4 = 0;
    if (0 < iVar14) {
      iVar4 = iVar14;
    }
    while (iVar4 != 0) {
      fcb->bufpos = iVar3 + 1;
      memcpy(fcb->cepbuf[iVar3],fcb->cepbuf[iVar2],sVar8);
      iVar3 = fcb->bufpos % 0x100;
      fcb->bufpos = iVar3;
      iVar4 = iVar4 + -1;
    }
  }
  nfr = (iVar9 - iVar14) + (int)lVar13;
  if ((int)nfr < 1) {
    nfr = 0;
  }
  else {
    lVar7 = (long)iVar14;
    for (uVar5 = 0; uVar5 != (uint)((iVar9 - iVar14) + (int)lVar13); uVar5 = uVar5 + 1) {
      iVar3 = fcb->curpos;
      if (iVar14 + iVar3 < 0x100 && iVar14 <= iVar3) {
        ppmVar11 = fcb->cepbuf + iVar3;
      }
      else {
        iVar3 = iVar3 + (0x100 - iVar14);
        for (lVar10 = (long)-iVar14; lVar10 <= lVar7; lVar10 = lVar10 + 1) {
          fcb->tmpcepbuf[lVar7 + lVar10] = fcb->cepbuf[iVar3 % 0x100];
          iVar3 = iVar3 + 1;
        }
        ppmVar11 = fcb->tmpcepbuf + lVar7;
      }
      (*fcb->compute_feat)(fcb,ppmVar11,ofeat[uVar5]);
      fcb->curpos = (fcb->curpos + 1) % 0x100;
    }
    if (fcb->lda != (mfcc_t ***)0x0) {
      feat_lda_transform(fcb,ofeat,nfr);
    }
    if (fcb->subvecs != (int32 **)0x0) {
      feat_subvec_project(fcb,ofeat,nfr);
    }
  }
  return nfr;
}

Assistant:

int32
feat_s2mfc2feat_live(feat_t * fcb, mfcc_t ** uttcep, int32 *inout_ncep,
		     int32 beginutt, int32 endutt, mfcc_t *** ofeat)
{
    int32 win, cepsize, nbufcep;
    int32 i, j, nfeatvec;
    int32 zero = 0;

    /* Avoid having to check this everywhere. */
    if (inout_ncep == NULL) inout_ncep = &zero;

    /* Special case for entire utterances. */
    if (beginutt && endutt && *inout_ncep > 0)
        return feat_s2mfc2feat_block_utt(fcb, uttcep, *inout_ncep, ofeat);

    win = feat_window_size(fcb);
    cepsize = feat_cepsize(fcb);

    /* Empty the input buffer on start of utterance. */
    if (beginutt)
        fcb->bufpos = fcb->curpos;

    /* Calculate how much data is in the buffer already. */
    nbufcep = fcb->bufpos - fcb->curpos;
    if (nbufcep < 0)
	nbufcep = fcb->bufpos + LIVEBUFBLOCKSIZE - fcb->curpos;
    /* Add any data that we have to replicate. */
    if (beginutt && *inout_ncep > 0)
        nbufcep += win;
    if (endutt)
        nbufcep += win;

    /* Only consume as much input as will fit in the buffer. */
    if (nbufcep + *inout_ncep > LIVEBUFBLOCKSIZE) {
        /* We also can't overwrite the trailing window, hence the
         * reason why win is subtracted here. */
        *inout_ncep = LIVEBUFBLOCKSIZE - nbufcep - win;
        /* Cancel end of utterance processing. */
        endutt = FALSE;
    }

    /* FIXME: Don't modify the input! */
    feat_cmn(fcb, uttcep, *inout_ncep, beginutt, endutt);
    feat_agc(fcb, uttcep, *inout_ncep, beginutt, endutt);

    /* Replicate first frame into the first win frames if we're at the
     * beginning of the utterance and there was some actual input to
     * deal with.  (FIXME: Not entirely sure why that condition) */
    if (beginutt && *inout_ncep > 0) {
        for (i = 0; i < win; i++) {
            memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[0],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
        /* Move the current pointer past this data. */
        fcb->curpos = fcb->bufpos;
        nbufcep -= win;
    }

    /* Copy in frame data to the circular buffer. */
    for (i = 0; i < *inout_ncep; ++i) {
        memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[i],
               cepsize * sizeof(mfcc_t));
        fcb->bufpos %= LIVEBUFBLOCKSIZE;
	++nbufcep;
    }

    /* Replicate last frame into the last win frames if we're at the
     * end of the utterance (even if there was no input, so we can
     * flush the output). */
    if (endutt) {
        int32 tpos; /* Index of last input frame. */
        if (fcb->bufpos == 0)
            tpos = LIVEBUFBLOCKSIZE - 1;
        else
            tpos = fcb->bufpos - 1;
        for (i = 0; i < win; ++i) {
            memcpy(fcb->cepbuf[fcb->bufpos++], fcb->cepbuf[tpos],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
    }

    /* We have to leave the trailing window of frames. */
    nfeatvec = nbufcep - win;
    if (nfeatvec <= 0)
        return 0; /* Do nothing. */

    for (i = 0; i < nfeatvec; ++i) {
        /* Handle wraparound cases. */
        if (fcb->curpos - win < 0 || fcb->curpos + win >= LIVEBUFBLOCKSIZE) {
            /* Use tmpcepbuf for this case.  Actually, we just need the pointers. */
            for (j = -win; j <= win; ++j) {
                int32 tmppos =
                    (fcb->curpos + j + LIVEBUFBLOCKSIZE) % LIVEBUFBLOCKSIZE;
		fcb->tmpcepbuf[win + j] = fcb->cepbuf[tmppos];
            }
            fcb->compute_feat(fcb, fcb->tmpcepbuf + win, ofeat[i]);
        }
        else {
            fcb->compute_feat(fcb, fcb->cepbuf + fcb->curpos, ofeat[i]);
        }
	/* Move the read pointer forward. */
        ++fcb->curpos;
        fcb->curpos %= LIVEBUFBLOCKSIZE;
    }

    if (fcb->lda)
        feat_lda_transform(fcb, ofeat, nfeatvec);

    if (fcb->subvecs)
        feat_subvec_project(fcb, ofeat, nfeatvec);

    return nfeatvec;
}